

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

void write2_cb(uv_write_t *req,int status)

{
  int status_local;
  uv_write_t *req_local;
  
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x11d,"status == 0");
    abort();
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && ((is_child_process != 0 || (is_in_process != 0)))) {
    uv_close(0x2ce130,0);
    uv_close(0x2ce268,0);
    uv_close(0x2cdea0,0);
    uv_close(&ctx2,0);
  }
  return;
}

Assistant:

static void write2_cb(uv_write_t* req, int status) {
  ASSERT(status == 0);

  /* After two successful writes in the child process, allow the child
   * process to be closed. */
  if (++write2_cb_called == 2 && (is_child_process || is_in_process)) {
    uv_close(&ctx2.recv.handle, NULL);
    uv_close(&ctx2.recv2.handle, NULL);
    uv_close((uv_handle_t*)&ctx2.channel, NULL);
    uv_close((uv_handle_t*)&ctx2.listen, NULL);
  }
}